

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agc.c
# Opt level: O0

agc_type_t agc_type_from_str(char *str)

{
  int iVar1;
  agc_type_t local_1c;
  int i;
  char *str_local;
  
  local_1c = AGC_NONE;
  while( true ) {
    if (3 < (int)local_1c) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/agc.c"
              ,0x57,"Unknown AGC type \'%s\'\n",str);
      exit(1);
    }
    iVar1 = strcmp(str,agc_type_str[(int)local_1c]);
    if (iVar1 == 0) break;
    local_1c = local_1c + AGC_MAX;
  }
  return local_1c;
}

Assistant:

agc_type_t
agc_type_from_str(const char *str)
{
    int i;

    for (i = 0; i < n_agc_type_str; ++i) {
        if (0 == strcmp(str, agc_type_str[i]))
            return (agc_type_t)i;
    }
    E_FATAL("Unknown AGC type '%s'\n", str);
    return AGC_NONE;
}